

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O2

void __thiscall QPropertyAnimation::setTargetObject(QPropertyAnimation *this,QObject *target)

{
  QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
  *this_00;
  QPropertyAnimationPrivate *this_01;
  QObject *this_02;
  parameter_type pVar1;
  QSlotObjectBase *slotObjRaw;
  long in_FS_OFFSET;
  undefined1 local_60 [12];
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QPropertyAnimationPrivate **)(this + 8);
  pVar1 = QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
          ::value(&(this_01->super_QVariantAnimationPrivate).super_QAbstractAnimationPrivate.state);
  if (pVar1 == Stopped) {
    this_00 = &this_01->targetObject;
    QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
    ::removeBindingUnlessInWrapper(this_00);
    this_02 = (this_01->targetObject).super_QPropertyData<QObject_*>.val;
    if (this_02 != target) {
      if (this_02 != (QObject *)0x0) {
        QObject::disconnect<void(QObject::*)(QObject*)>
                  (this_02,(Object *)QObject::destroyed,0,(QObject *)this,(void **)0x0);
      }
      (this_00->super_QPropertyData<QObject_*>).val = target;
      if (target != (QObject *)0x0) {
        local_60._8_4_ = 0x2893d6;
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        slotObjRaw = (QSlotObjectBase *)operator_new(0x18);
        (slotObjRaw->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i = 1;
        slotObjRaw->m_impl =
             QtPrivate::
             QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/animation/qpropertyanimation.cpp:180:26),_QtPrivate::List<>,_void>
             ::impl;
        *(QPropertyAnimationPrivate **)(slotObjRaw + 1) = this_01;
        QObject::connectImpl
                  ((QObject *)local_60,target,(void **)(local_60 + 8),(QObject *)this,(void **)0x0,
                   slotObjRaw,AutoConnection,(int *)0x0,&QObject::staticMetaObject);
        QMetaObject::Connection::~Connection((Connection *)local_60);
      }
      QPropertyAnimationPrivate::updateMetaProperty(this_01);
      QObjectCompatProperty<QPropertyAnimationPrivate,_QObject_*,_&QPropertyAnimationPrivate::_qt_property_targetObject_offset,_&QPropertyAnimationPrivate::setTargetObjectForwarder,_nullptr,_nullptr>
      ::notify(this_00);
    }
  }
  else {
    local_60._8_4_ = 2;
    local_44 = 0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((QMessageLogger *)(local_60 + 8),
               "QPropertyAnimation::setTargetObject: you can\'t change the target of a running animation"
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPropertyAnimation::setTargetObject(QObject *target)
{
    Q_D(QPropertyAnimation);
    if (d->state != QAbstractAnimation::Stopped) {
        qWarning("QPropertyAnimation::setTargetObject: you can't change the target of a running animation");
        return;
    }

    d->targetObject.removeBindingUnlessInWrapper();
    const QObject *oldTarget = d->targetObject.valueBypassingBindings();
    if (oldTarget == target)
        return;

    if (oldTarget != nullptr)
        QObject::disconnect(oldTarget, &QObject::destroyed, this, nullptr);
    d->targetObject.setValueBypassingBindings(target);

    if (target != nullptr) {
        QObject::connect(target, &QObject::destroyed, this,
                         [d] { d->targetObjectDestroyed(); });
    }
    d->updateMetaProperty();
    d->targetObject.notify();
}